

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::ElemSegment::ElemSegment(ElemSegment *this,ElemDesc *desc,Ptr *inst)

{
  bool bVar1;
  size_type __n;
  reference pEVar2;
  Instance *pIVar3;
  reference __args;
  ElemExpr *elem_expr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_> *__range2;
  Ptr *inst_local;
  ElemDesc *desc_local;
  ElemSegment *this_local;
  
  this->desc_ = desc;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->elements_);
  __n = std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::size
                  (&desc->elements);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::reserve(&this->elements_,__n);
  __end2 = std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::begin
                     (&desc->elements);
  elem_expr = (ElemExpr *)
              std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::end
                        (&desc->elements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wabt::interp::ElemExpr_*,_std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>_>
                                     *)&elem_expr), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::interp::ElemExpr_*,_std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>_>
             ::operator*(&__end2);
    if (pEVar2->kind == RefNull) {
      std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
      emplace_back<wabt::interp::Ref_const&>
                ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&this->elements_,
                 (Ref *)&Ref::Null);
    }
    else if (pEVar2->kind == RefFunc) {
      pIVar3 = RefPtr<wabt::interp::Instance>::operator->(inst);
      __args = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                         (&pIVar3->funcs_,(ulong)pEVar2->index);
      std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
      emplace_back<wabt::interp::Ref&>
                ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&this->elements_,
                 __args);
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::ElemExpr_*,_std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

ElemSegment::ElemSegment(const ElemDesc* desc, Instance::Ptr& inst)
    : desc_(desc) {
  elements_.reserve(desc->elements.size());
  for (auto&& elem_expr : desc->elements) {
    switch (elem_expr.kind) {
      case ElemKind::RefNull:
        elements_.emplace_back(Ref::Null);
        break;

      case ElemKind::RefFunc:
        elements_.emplace_back(inst->funcs_[elem_expr.index]);
        break;
    }
  }
}